

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timTime.c
# Opt level: O0

float Tim_ManGetCoRequired(Tim_Man_t *p,int iCo)

{
  Tim_Obj_t *pTVar1;
  Tim_Box_t *pBox_00;
  float *pfVar2;
  long lVar3;
  bool bVar4;
  int local_5c;
  uint local_58;
  int k;
  int i;
  float DelayBest;
  float *pDelays;
  float *pTable;
  Tim_Obj_t *pObjRes;
  Tim_Obj_t *pObj;
  Tim_Obj_t *pObjThis;
  Tim_Box_t *pBox;
  int iCo_local;
  Tim_Man_t *p_local;
  
  pTVar1 = Tim_ManCo(p,iCo);
  if ((p->fUseTravId == 0) || (pTVar1->TravId != p->nTravIds)) {
    pTVar1->TravId = p->nTravIds;
    pBox_00 = Tim_ManCoBox(p,iCo);
    if (pBox_00 == (Tim_Box_t *)0x0) {
      p_local._4_4_ = pTVar1->timeReq;
    }
    else {
      pBox_00->TravId = p->nTravIds;
      if (p->fUseTravId != 0) {
        local_58 = 0;
        while( true ) {
          bVar4 = false;
          if ((int)local_58 < pBox_00->nOutputs) {
            pObjRes = Tim_ManBoxOutput(p,pBox_00,local_58);
            bVar4 = pObjRes != (Tim_Obj_t *)0x0;
          }
          if (!bVar4) break;
          if (pObjRes->TravId != p->nTravIds) {
            printf("Tim_ManGetCoRequired(): Output required times of output %d the box %d are not up to date!\n"
                   ,(ulong)local_58,(ulong)(uint)pBox_00->iBox);
          }
          local_58 = local_58 + 1;
        }
      }
      pfVar2 = Tim_ManBoxDelayTable(p,pBox_00->iBox);
      local_58 = 0;
      while( true ) {
        bVar4 = false;
        if ((int)local_58 < pBox_00->nInputs) {
          pTable = (float *)Tim_ManBoxInput(p,pBox_00,local_58);
          bVar4 = (Tim_Obj_t *)pTable != (Tim_Obj_t *)0x0;
        }
        if (!bVar4) break;
        k = 0x4e6e6b28;
        local_5c = 0;
        while( true ) {
          bVar4 = false;
          if (local_5c < pBox_00->nOutputs) {
            pObjRes = Tim_ManBoxOutput(p,pBox_00,local_5c);
            bVar4 = pObjRes != (Tim_Obj_t *)0x0;
          }
          if (!bVar4) break;
          lVar3 = (long)(local_5c * pBox_00->nInputs);
          if ((pfVar2[lVar3 + (long)local_5c + 3] != -1e+09) ||
             (NAN(pfVar2[lVar3 + (long)local_5c + 3]))) {
            k = (int)Abc_MinFloat((float)k,pObjRes->timeReq -
                                           pfVar2[lVar3 + (long)(int)local_58 + 3]);
          }
          local_5c = local_5c + 1;
        }
        pTable[5] = (float)k;
        pTable[1] = (float)p->nTravIds;
        local_58 = local_58 + 1;
      }
      p_local._4_4_ = pTVar1->timeReq;
    }
  }
  else {
    p_local._4_4_ = pTVar1->timeReq;
  }
  return p_local._4_4_;
}

Assistant:

float Tim_ManGetCoRequired( Tim_Man_t * p, int iCo )
{
    Tim_Box_t * pBox;
    Tim_Obj_t * pObjThis, * pObj, * pObjRes;
    float * pTable, * pDelays, DelayBest;
    int i, k;
    // consider the already processed PO
    pObjThis = Tim_ManCo( p, iCo );
    if ( p->fUseTravId && pObjThis->TravId == p->nTravIds )
        return pObjThis->timeReq;
    pObjThis->TravId = p->nTravIds;
    // consider the main PO
    pBox = Tim_ManCoBox( p, iCo );
    if ( pBox == NULL )
        return pObjThis->timeReq;
    // update box timing
    pBox->TravId = p->nTravIds;
    // get the required times of the outputs of the box (PIs)
    if ( p->fUseTravId )
    Tim_ManBoxForEachOutput( p, pBox, pObj, i )
        if ( pObj->TravId != p->nTravIds )
            printf( "Tim_ManGetCoRequired(): Output required times of output %d the box %d are not up to date!\n", i, pBox->iBox );
    // compute the required times for each input of the box (POs)
    pTable = Tim_ManBoxDelayTable( p, pBox->iBox );
    Tim_ManBoxForEachInput( p, pBox, pObjRes, i )
    {
        DelayBest = TIM_ETERNITY;
        Tim_ManBoxForEachOutput( p, pBox, pObj, k )
        {
            pDelays = pTable + 3 + k * pBox->nInputs;
            if ( pDelays[k] != -ABC_INFINITY )
                DelayBest = Abc_MinFloat( DelayBest, pObj->timeReq - pDelays[i] );
        }
        pObjRes->timeReq = DelayBest;
        pObjRes->TravId = p->nTravIds;
    }
    return pObjThis->timeReq;
}